

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::AsyncIoStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::getConnectStream(Connection *this)

{
  WeakFulfillerBase *pWVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  OwnPromiseNode OVar6;
  PromiseBase node;
  AsyncIoStream *pAVar7;
  long *plVar8;
  uchar *puVar9;
  size_t sVar10;
  None *pNVar11;
  char *pcVar12;
  WeakFulfiller<void> *params;
  AsyncIoStream *pAVar13;
  Disposer *pDVar14;
  AsyncIoStreamWithGuards *this_00;
  AsyncIoStream *extraout_RDX;
  AsyncIoStream *extraout_RDX_00;
  AsyncIoStream *extraout_RDX_01;
  AsyncIoStream *extraout_RDX_02;
  AsyncIoStream *extraout_RDX_03;
  AsyncIoStream *extraout_RDX_04;
  AsyncIoStream *extraout_RDX_05;
  AsyncIoStream *extraout_RDX_06;
  AsyncIoStream *extraout_RDX_07;
  _func_int **in_RSI;
  Own<kj::AsyncIoStream,_std::nullptr_t> OVar15;
  OwnPromiseNode local_f0;
  PromiseBase local_e8;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_e0;
  OwnPromiseNode local_d0;
  WeakFulfillerBase *local_c8;
  long *local_c0;
  ReleasedBuffer releasedBuffer;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Fault f;
  anon_union_40_1_a8c68091_for_NullableValue<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_2
  local_58;
  
  _kjCondition.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x31)
  ;
  _kjCondition.result = in_RSI[0x32] == (_func_int *)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    pWVar1 = &params->super_WeakFulfillerBase;
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_00629ab8;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_00629af0;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&_kjCondition,params);
    local_d0.ptr = (PromiseNode *)_kjCondition.left;
    local_c0 = (long *)0x0;
    p_Var2 = in_RSI[0x31];
    p_Var3 = in_RSI[0x32];
    in_RSI[0x31] = (_func_int *)pWVar1;
    in_RSI[0x32] = (_func_int *)params;
    local_c8 = pWVar1;
    if (p_Var3 != (_func_int *)0x0) {
      (*(code *)**(undefined8 **)p_Var2)(p_Var2,p_Var3 + *(long *)(*(long *)p_Var3 + -0x10));
    }
    releasedBuffer.buffer.disposer = (ArrayDisposer *)in_RSI[0xc];
    if (releasedBuffer.buffer.disposer == (ArrayDisposer *)0x0) {
      releasedBuffer.buffer.ptr = (uchar *)0x0;
      releasedBuffer.buffer.size_ = 0;
      releasedBuffer.buffer.disposer = (ArrayDisposer *)0x0;
    }
    else {
      releasedBuffer.buffer.ptr = (uchar *)in_RSI[10];
      releasedBuffer.buffer.size_ = (size_t)in_RSI[0xb];
      in_RSI[10] = (_func_int *)0x0;
      in_RSI[0xb] = (_func_int *)0x0;
    }
    pp_Var4 = (_func_int **)in_RSI[4];
    pp_Var5 = (_func_int **)in_RSI[0xe];
    releasedBuffer.leftover.size_ = (size_t)in_RSI[0xf];
    releasedBuffer.leftover.ptr = (uchar *)pp_Var5;
    pAVar13 = (AsyncIoStream *)operator_new(0x48);
    sVar10 = releasedBuffer.buffer.size_;
    puVar9 = releasedBuffer.buffer.ptr;
    releasedBuffer.buffer.ptr = (uchar *)0x0;
    releasedBuffer.buffer.size_ = 0;
    (pAVar13->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_00643120;
    (pAVar13->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)&PTR_write_006431c0;
    pAVar13[1].super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)&NullDisposer::instance
    ;
    pAVar13[1].super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var4;
    pAVar13[2].super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)puVar9;
    pAVar13[2].super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)sVar10;
    pAVar13[3].super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)releasedBuffer.buffer.disposer;
    pAVar13[3].super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var5;
    pAVar13[4].super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)releasedBuffer.leftover.size_;
    pDVar14 = (Disposer *)operator_new(0x28);
    *(undefined1 *)&pDVar14[1]._vptr_Disposer = 1;
    pDVar14[2]._vptr_Disposer = in_RSI;
    pDVar14[3]._vptr_Disposer =
         (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithInitialBuffer>::instance;
    pDVar14[4]._vptr_Disposer = (_func_int **)pAVar13;
    pDVar14->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_00643348;
    f.exception._0_1_ = '\0';
    this_00 = (AsyncIoStreamWithGuards *)operator_new(0x88);
    local_e0.disposer = pDVar14;
    local_e0.ptr = pAVar13;
    Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
              ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)
               &_kjCondition,
               (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&f);
    Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
              ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_f0,
               (FixVoid<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&_kjCondition);
    local_e8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_d0.ptr;
    local_d0.ptr = (PromiseNode *)0x0;
    AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
              (this_00,&local_e0,
               (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_f0,(Promise<void> *)&local_e8);
    node.node.ptr = local_e8.node.ptr;
    pAVar13 = extraout_RDX;
    if (local_e8.node.ptr != (PromiseNode *)0x0) {
      local_e8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
      pAVar13 = extraout_RDX_00;
    }
    OVar6.ptr = local_f0.ptr;
    if (&(local_f0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_f0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar6.ptr)->super_PromiseArenaMember);
      pAVar13 = extraout_RDX_01;
    }
    pcVar12 = _kjCondition.op.content.ptr;
    pNVar11 = _kjCondition.right;
    if (((char)_kjCondition.left == '\x01') && (_kjCondition.right != (None *)0x0)) {
      _kjCondition.right = (None *)0x0;
      _kjCondition.op.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)_kjCondition.op.content.size_)
                (_kjCondition.op.content.size_,pNVar11,1,pcVar12,pcVar12,0);
      pAVar13 = extraout_RDX_02;
    }
    pAVar7 = local_e0.ptr;
    if (local_e0.ptr != (AsyncIoStream *)0x0) {
      local_e0.ptr = (AsyncIoStream *)0x0;
      (**(local_e0.disposer)->_vptr_Disposer)
                (local_e0.disposer,
                 (pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                 (long)&(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream);
      pAVar13 = extraout_RDX_03;
    }
    (this->super_Response)._vptr_Response =
         (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
    (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)this_00;
    if (((char)f.exception == '\x01') && (local_58.value.buffer.ptr != (uchar *)0x0)) {
      (**(local_58.value.buffer.disposer)->_vptr_ArrayDisposer)
                (local_58.value.buffer.disposer,local_58.value.buffer.ptr,1,
                 local_58.value.buffer.size_,local_58.value.buffer.size_,0);
      pAVar13 = extraout_RDX_04;
    }
    sVar10 = releasedBuffer.buffer.size_;
    puVar9 = releasedBuffer.buffer.ptr;
    if (releasedBuffer.buffer.ptr != (uchar *)0x0) {
      releasedBuffer.buffer.ptr = (uchar *)0x0;
      releasedBuffer.buffer.size_ = 0;
      (**(releasedBuffer.buffer.disposer)->_vptr_ArrayDisposer)
                (releasedBuffer.buffer.disposer,puVar9,1,sVar10,sVar10,0);
      pAVar13 = extraout_RDX_05;
    }
    plVar8 = local_c0;
    if (local_c0 != (long *)0x0) {
      local_c0 = (long *)0x0;
      (**(local_c8->super_Disposer)._vptr_Disposer)
                (local_c8,(long)plVar8 + *(long *)(*plVar8 + -0x10));
      pAVar13 = extraout_RDX_06;
    }
    OVar6.ptr = (PromiseNode *)local_d0;
    if (&(local_d0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_d0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar6.ptr)->super_PromiseArenaMember);
      pAVar13 = extraout_RDX_07;
    }
    OVar15.ptr = pAVar13;
    OVar15.disposer = (Disposer *)this;
    return OVar15;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f89,FAILED,"tunnelWriteGuard == kj::none",
             "_kjCondition,\"the tunnel stream was already retrieved\"",&_kjCondition,
             (char (*) [40])"the tunnel stream was already retrieved");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<kj::AsyncIoStream> getConnectStream() {
    // Returns an AsyncIoStream over the internal stream but that waits for a Promise to be
    // resolved to allow writes after either accept or reject are called. Reads are allowed
    // immediately.
    KJ_REQUIRE(tunnelWriteGuard == kj::none, "the tunnel stream was already retrieved");
    auto paf = kj::newPromiseAndFulfiller<void>();
    tunnelWriteGuard = kj::mv(paf.fulfiller);

    kj::Own<kj::AsyncIoStream> ownStream(&stream, kj::NullDisposer::instance);
    auto releasedBuffer = httpInput.releaseBuffer();
    auto deferNoteClosed = kj::defer([this]() { webSocketOrConnectClosed = true; });
    return kj::heap<AsyncIoStreamWithGuards>(
        kj::heap<AsyncIoStreamWithInitialBuffer>(
            kj::mv(ownStream),
            kj::mv(releasedBuffer.buffer),
            releasedBuffer.leftover).attach(kj::mv(deferNoteClosed)),
        kj::Maybe<HttpInputStreamImpl::ReleasedBuffer>(kj::none),
        kj::mv(paf.promise));
  }